

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

wchar_t tval_sval_count(char *name)

{
  wchar_t wVar1;
  object_kind *kind;
  wchar_t tval;
  size_t num;
  size_t i;
  char *name_local;
  
  name_local._4_4_ = L'\0';
  wVar1 = tval_find_idx(name);
  if (wVar1 < L'\0') {
    name_local._4_4_ = L'\0';
  }
  else {
    for (num = 0; num < z_info->k_max; num = num + 1) {
      if ((k_info[num].tval != 0) && (k_info[num].tval == wVar1)) {
        name_local._4_4_ = name_local._4_4_ + L'\x01';
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

int tval_sval_count(const char *name)
{
	size_t i, num = 0;
	int tval = tval_find_idx(name);

	if (tval < 0) return 0;

	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		if (!kind->tval) continue;
		if (kind->tval != tval) continue;
		num++;
	}

	return num;
}